

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  long lVar1;
  uint uVar2;
  int *piVar3;
  Allocator *pAVar4;
  size_t sVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  undefined1 auVar39 [14];
  undefined1 auVar40 [14];
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [14];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [14];
  undefined1 auVar61 [14];
  undefined1 auVar62 [14];
  undefined1 auVar63 [14];
  undefined1 auVar64 [14];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [14];
  undefined1 auVar69 [14];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [14];
  undefined1 auVar74 [14];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined4 uVar78;
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined8 uVar82;
  undefined1 auVar83 [12];
  undefined1 auVar84 [14];
  undefined1 auVar85 [12];
  undefined1 auVar86 [14];
  undefined1 auVar87 [12];
  undefined1 auVar88 [14];
  undefined1 auVar89 [12];
  undefined1 auVar90 [14];
  undefined1 auVar91 [14];
  undefined1 auVar92 [14];
  undefined1 auVar93 [14];
  undefined1 auVar94 [14];
  undefined1 auVar95 [14];
  undefined1 auVar96 [14];
  undefined1 auVar97 [14];
  undefined1 auVar98 [14];
  undefined1 auVar99 [14];
  undefined1 auVar100 [14];
  undefined1 auVar101 [14];
  undefined1 auVar102 [14];
  undefined1 auVar103 [12];
  undefined1 auVar104 [14];
  undefined1 auVar105 [14];
  undefined1 auVar106 [14];
  undefined1 auVar107 [14];
  undefined1 auVar108 [14];
  undefined1 auVar109 [14];
  undefined1 auVar110 [14];
  undefined1 auVar111 [14];
  undefined1 auVar112 [14];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined1 auVar117 [12];
  undefined1 auVar118 [16];
  undefined1 auVar119 [12];
  undefined6 uVar120;
  Option *pOVar121;
  int n;
  uint uVar122;
  long lVar123;
  undefined4 *puVar124;
  uint uVar125;
  uint uVar126;
  ulong uVar127;
  long lVar128;
  long lVar129;
  void *pvVar130;
  ulong uVar131;
  long lVar132;
  void *pvVar133;
  undefined4 *puVar134;
  void *pvVar135;
  undefined8 *puVar136;
  uint uVar137;
  Mat *dst;
  size_t sVar138;
  void *pvVar139;
  long lVar140;
  long lVar141;
  void *pvVar142;
  void *pvVar143;
  undefined8 *puVar144;
  int iVar145;
  ulong uVar146;
  undefined4 *puVar147;
  ulong uVar148;
  ulong uVar149;
  void *pvVar150;
  ulong uVar151;
  long lVar152;
  long lVar153;
  undefined4 *puVar154;
  long lVar155;
  long lVar156;
  void *pvVar157;
  long lVar158;
  void *pvVar159;
  uint uVar160;
  uint uVar162;
  undefined1 auVar161 [16];
  int iVar163;
  int iVar177;
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  short sVar205;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  ushort uVar231;
  short sVar232;
  short sVar233;
  int iVar234;
  undefined1 in_XMM3 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  ushort uVar235;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  int iVar236;
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  undefined1 auVar227 [16];
  undefined4 uVar237;
  undefined1 in_XMM4 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined4 uVar245;
  short sVar257;
  short sVar259;
  uint uVar258;
  undefined1 in_XMM5 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  short sVar274;
  short sVar275;
  undefined1 auVar260 [12];
  undefined1 auVar261 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar276 [12];
  undefined1 auVar279 [12];
  undefined1 auVar280 [16];
  Mat top_blob_bordered;
  void *local_2f8;
  void *local_2f0;
  void *local_2e8;
  void *local_2e0;
  int *local_2d0;
  int tiles;
  void *local_2b0;
  int *local_2a0;
  void *local_298;
  void *local_258;
  void *local_250;
  void *local_248;
  void *local_240;
  void *local_238;
  void *local_230;
  long local_228;
  uint uStack_21c;
  undefined1 local_218 [48];
  undefined8 uStack_1e8;
  size_t local_1e0;
  Allocator *local_1d8;
  Option *local_1d0;
  ulong local_1c8;
  long local_1c0;
  void *local_1b8;
  ulong local_1b0;
  void *local_1a8;
  void *local_1a0;
  void *local_198;
  void *local_190;
  uint local_184;
  void *local_180;
  short d1 [4];
  undefined8 uStack_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  short d2 [4];
  int aiStack_130 [2];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  short d3 [4];
  int aiStack_e0 [2];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  ulong local_a0;
  Mat *local_98;
  long local_90;
  size_t local_88;
  long local_80;
  uint local_78;
  uint uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int s3 [4];
  Option opt_b;
  undefined1 auVar165 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined2 uVar176;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 uVar202;
  undefined1 uVar203;
  undefined1 uVar204;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar210 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  short sVar256;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar267 [16];
  undefined1 auVar264 [16];
  undefined1 auVar268 [16];
  short sVar277;
  short sVar278;
  undefined1 auVar281 [16];
  
  local_f8._0_4_ = top_blob->w;
  local_f8._4_4_ = top_blob->h;
  uStack_f0 = 0;
  uVar2 = top_blob->c;
  local_218._0_8_ = bottom_blob->data;
  piVar3 = bottom_blob->refcount;
  local_218._8_4_ = SUB84(piVar3,0);
  local_218._12_4_ = (undefined4)((ulong)piVar3 >> 0x20);
  local_218._16_8_ = bottom_blob->elemsize;
  local_218._24_4_ = bottom_blob->elempack;
  local_218._32_8_ = bottom_blob->allocator;
  uVar78 = bottom_blob->c;
  local_218._40_4_ = bottom_blob->dims;
  local_218._44_4_ = bottom_blob->w;
  uStack_1e8._0_4_ = bottom_blob->h;
  uStack_1e8._4_4_ = bottom_blob->c;
  local_1e0 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  iVar163 = (int)local_f8 + 1;
  iVar177 = local_f8._4_4_ + 1;
  local_78 = iVar163 - (iVar163 >> 0x1f) & 0xfffffffe;
  local_184 = iVar177 - (iVar177 >> 0x1f) & 0xfffffffe;
  uStack_70 = 0;
  uStack_6c = 0;
  local_a0 = (ulong)local_78;
  iVar145 = local_78 + 2;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.blob_allocator = opt->workspace_allocator;
  dst = (Mat *)local_218;
  uStack_74 = local_184;
  copy_make_border(bottom_blob,dst,0,(local_184 - bottom_blob->h) + 2,0,iVar145 - bottom_blob->w,0,
                   0.0,&opt_b);
  uVar237 = SUB84(dst,0);
  uVar160 = iVar163 / 2;
  uVar162 = iVar177 / 2;
  uVar125 = uVar162 * uVar160;
  pAVar4 = opt->workspace_allocator;
  uVar127 = (ulong)(int)(uVar125 * 0x10);
  lVar123 = (long)(int)uVar78;
  lVar155 = (uVar127 & 0x7ffffffffffffff0) * lVar123;
  local_1d0 = opt;
  local_98 = top_blob;
  if (lVar155 == 0) {
    local_2d0 = (int *)0x0;
    local_2f0 = (void *)0x0;
  }
  else {
    sVar138 = lVar155 * 2 + 4;
    if (pAVar4 == (Allocator *)0x0) {
      top_blob_bordered.data = (void *)0x0;
      uVar237 = 0x10;
      iVar163 = posix_memalign(&top_blob_bordered.data,0x10,sVar138);
      if (iVar163 != 0) {
        top_blob_bordered.data = (void *)0x0;
      }
    }
    else {
      top_blob_bordered.data = (void *)(**(code **)(*(long *)pAVar4 + 0x10))();
      uVar237 = (undefined4)sVar138;
    }
    local_2d0 = (int *)((long)top_blob_bordered.data + lVar155 * 2);
    *(undefined4 *)((long)top_blob_bordered.data + lVar155 * 2) = 1;
    local_2f0 = top_blob_bordered.data;
  }
  auVar214 = _DAT_0017c660;
  uVar131 = (ulong)(uint)uVar78;
  if (0 < (int)uVar78) {
    lVar155 = (long)iVar145;
    auVar161._0_4_ = -(uint)(0 < (int)local_f8);
    auVar161._4_4_ = -(uint)(0 < (int)local_f8);
    auVar161._8_4_ = -(uint)(0 < local_f8._4_4_);
    auVar161._12_4_ = -(uint)(0 < local_f8._4_4_);
    uVar137 = movmskpd(uVar237,auVar161);
    uVar122 = 1;
    if (1 < (int)uVar160) {
      uVar122 = uVar160;
    }
    uVar146 = 1;
    if (1 < (int)uVar162) {
      uVar146 = (ulong)uVar162;
    }
    uVar149 = 0;
    do {
      if ((byte)((byte)uVar137 >> 1) != 0) {
        pvVar157 = (void *)(uVar127 * 2 * uVar149 + (long)local_2f0);
        uVar151 = 0;
        do {
          if ((uVar137 & 1) != 0) {
            puVar154 = (undefined4 *)
                       (local_218._0_8_ +
                       (long)(iVar145 * 2 * (int)uVar151) + local_1e0 * local_218._16_8_ * uVar149);
            puVar134 = (undefined4 *)(lVar155 + (long)puVar154);
            puVar124 = (undefined4 *)(lVar155 + (long)puVar134);
            puVar147 = (undefined4 *)((long)puVar124 + lVar155);
            uVar126 = 0;
            do {
              auVar161 = _d3;
              uVar237 = *puVar154;
              auVar6[0xd] = 0;
              auVar6._0_13_ = in_XMM3._0_13_;
              auVar6[0xe] = in_XMM3[7];
              auVar29[0xc] = in_XMM3[6];
              auVar29._0_12_ = in_XMM3._0_12_;
              auVar29._13_2_ = auVar6._13_2_;
              auVar57[0xb] = 0;
              auVar57._0_11_ = in_XMM3._0_11_;
              auVar57._12_3_ = auVar29._12_3_;
              auVar65[10] = in_XMM3[5];
              auVar65._0_10_ = in_XMM3._0_10_;
              auVar65._11_4_ = auVar57._11_4_;
              auVar70[9] = 0;
              auVar70._0_9_ = in_XMM3._0_9_;
              auVar70._10_5_ = auVar65._10_5_;
              auVar75[8] = in_XMM3[4];
              auVar75._0_8_ = in_XMM3._0_8_;
              auVar75._9_6_ = auVar70._9_6_;
              auVar206._8_7_ = auVar75._8_7_;
              auVar206[7] = (char)((uint)uVar237 >> 0x18);
              auVar206[6] = in_XMM3[3];
              auVar206[5] = (char)((uint)uVar237 >> 0x10);
              auVar206[4] = in_XMM3[2];
              auVar206[3] = (char)((uint)uVar237 >> 8);
              auVar206[2] = in_XMM3[1];
              auVar206[0] = in_XMM3[0];
              auVar206[1] = (char)uVar237;
              auVar206[0xf] = 0;
              auVar207 = psraw(auVar206,8);
              uVar237 = *puVar134;
              auVar7[0xd] = 0;
              auVar7._0_13_ = in_XMM4._0_13_;
              auVar7[0xe] = in_XMM4[7];
              auVar30[0xc] = in_XMM4[6];
              auVar30._0_12_ = in_XMM4._0_12_;
              auVar30._13_2_ = auVar7._13_2_;
              auVar58[0xb] = 0;
              auVar58._0_11_ = in_XMM4._0_11_;
              auVar58._12_3_ = auVar30._12_3_;
              auVar66[10] = in_XMM4[5];
              auVar66._0_10_ = in_XMM4._0_10_;
              auVar66._11_4_ = auVar58._11_4_;
              auVar71[9] = 0;
              auVar71._0_9_ = in_XMM4._0_9_;
              auVar71._10_5_ = auVar66._10_5_;
              auVar76[8] = in_XMM4[4];
              auVar76._0_8_ = in_XMM4._0_8_;
              auVar76._9_6_ = auVar71._9_6_;
              auVar238._8_7_ = auVar76._8_7_;
              auVar238[7] = (char)((uint)uVar237 >> 0x18);
              auVar238[6] = in_XMM4[3];
              auVar238[5] = (char)((uint)uVar237 >> 0x10);
              auVar238[4] = in_XMM4[2];
              auVar238[3] = (char)((uint)uVar237 >> 8);
              auVar238[2] = in_XMM4[1];
              auVar238[0] = in_XMM4[0];
              auVar238[1] = (char)uVar237;
              auVar238[0xf] = 0;
              auVar239 = psraw(auVar238,8);
              uVar237 = *puVar124;
              auVar8[0xd] = 0;
              auVar8._0_13_ = in_XMM5._0_13_;
              auVar8[0xe] = in_XMM5[7];
              auVar31[0xc] = in_XMM5[6];
              auVar31._0_12_ = in_XMM5._0_12_;
              auVar31._13_2_ = auVar8._13_2_;
              auVar59[0xb] = 0;
              auVar59._0_11_ = in_XMM5._0_11_;
              auVar59._12_3_ = auVar31._12_3_;
              auVar67[10] = in_XMM5[5];
              auVar67._0_10_ = in_XMM5._0_10_;
              auVar67._11_4_ = auVar59._11_4_;
              auVar72[9] = 0;
              auVar72._0_9_ = in_XMM5._0_9_;
              auVar72._10_5_ = auVar67._10_5_;
              auVar77[8] = in_XMM5[4];
              auVar77._0_8_ = in_XMM5._0_8_;
              auVar77._9_6_ = auVar72._9_6_;
              auVar246._8_7_ = auVar77._8_7_;
              auVar246[7] = (char)((uint)uVar237 >> 0x18);
              auVar246[6] = in_XMM5[3];
              auVar246[5] = (char)((uint)uVar237 >> 0x10);
              auVar246[4] = in_XMM5[2];
              auVar246[3] = (char)((uint)uVar237 >> 8);
              auVar246[2] = in_XMM5[1];
              auVar246[0] = in_XMM5[0];
              auVar246[1] = (char)uVar237;
              auVar246[0xf] = 0;
              auVar247 = psraw(auVar246,8);
              uVar237 = *puVar147;
              uVar204 = (undefined1)((uint)uVar237 >> 0x18);
              uVar203 = (undefined1)((uint)uVar237 >> 0x10);
              uVar202 = (undefined1)((uint)uVar237 >> 8);
              auVar178._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar204,uVar204),uVar203),
                                  CONCAT14(uVar203,uVar237)) >> 0x20);
              auVar178[3] = uVar202;
              auVar178[2] = uVar202;
              auVar178[0] = (undefined1)uVar237;
              auVar178[1] = auVar178[0];
              auVar178._8_8_ = 0;
              auVar179 = psraw(auVar178,8);
              sVar205 = auVar247._0_2_;
              auVar211._0_2_ = auVar207._0_2_ - sVar205;
              sVar256 = auVar247._2_2_;
              uVar231 = auVar207._2_2_ - sVar256;
              sVar257 = auVar247._4_2_;
              sVar232 = auVar207._4_2_ - sVar257;
              sVar259 = auVar247._6_2_;
              sVar233 = auVar207._6_2_ - sVar259;
              uVar237 = CONCAT22(sVar233,sVar232);
              uVar235 = auVar207._10_2_ - auVar247._10_2_;
              sVar274 = auVar239._0_2_;
              auVar276._0_2_ = sVar274 + sVar205;
              sVar275 = auVar239._2_2_;
              auVar276._2_2_ = sVar275 + sVar256;
              sVar277 = auVar239._4_2_;
              auVar276._4_2_ = sVar277 + sVar257;
              sVar278 = auVar239._6_2_;
              auVar276._6_2_ = sVar278 + sVar259;
              auVar276._8_2_ = auVar239._8_2_ + auVar247._8_2_;
              auVar276._10_2_ = auVar239._10_2_ + auVar247._10_2_;
              sVar256 = sVar256 - sVar275;
              uVar245 = CONCAT22(sVar256,sVar205 - sVar274);
              sVar259 = sVar259 - sVar278;
              auVar247._0_2_ = auVar179._0_2_ - sVar274;
              auVar247._2_2_ = auVar179._2_2_ - sVar275;
              auVar247._4_2_ = auVar179._4_2_ - sVar277;
              auVar247._6_2_ = auVar179._6_2_ - sVar278;
              auVar247._8_2_ = auVar179._8_2_ - auVar239._8_2_;
              auVar247._10_2_ = auVar179._10_2_ - auVar239._10_2_;
              auVar247._12_2_ = auVar179._12_2_ - auVar239._12_2_;
              auVar247._14_2_ = auVar179._14_2_ - auVar239._14_2_;
              auVar279._2_2_ = 0;
              auVar279._0_2_ = uVar231;
              auVar279._4_2_ = sVar233;
              auVar279._6_2_ = 0;
              auVar279._8_4_ = (uint)(((ulong)uVar235 << 0x30) >> 0x30);
              auVar260._0_8_ = CONCAT44(uVar237,uVar237);
              auVar260._8_4_ = uVar237;
              uVar120 = CONCAT24(auVar276._6_2_,CONCAT22(sVar233,uVar235));
              auVar119._2_4_ = (int)((uint6)uVar120 >> 0x10);
              auVar119._0_2_ = auVar276._4_2_;
              auVar119._6_6_ = 0;
              auVar115._2_2_ = auVar276._2_2_;
              auVar115._0_2_ = sVar232;
              auVar115._4_8_ = SUB128(auVar119 << 0x30,4);
              auVar79._2_10_ = auVar115._2_10_;
              auVar79._0_2_ = uVar231;
              auVar208._0_8_ = auVar79._0_8_ << 0x20;
              auVar279 = auVar276 & SUB1612(ZEXT416(0xffff0000),0) | auVar279;
              auVar264._12_2_ = sVar233;
              auVar264._0_12_ = auVar260;
              auVar264._14_2_ = auVar276._6_2_;
              auVar263._12_4_ = auVar264._12_4_;
              auVar263._0_10_ = auVar260._0_10_;
              auVar263._10_2_ = auVar276._4_2_;
              auVar262._10_6_ = auVar263._10_6_;
              auVar262._8_2_ = sVar232;
              auVar262._0_8_ = auVar260._0_8_;
              auVar261._8_8_ = auVar262._8_8_;
              auVar261._6_2_ = auVar276._6_2_;
              auVar261._4_2_ = sVar233;
              auVar261._0_4_ = uVar237;
              auVar265._0_8_ = auVar261._4_8_ << 0x20;
              uVar237 = CONCAT22(auVar276._6_2_,sVar233);
              uVar258 = (uint)(CONCAT26(sVar259,CONCAT24(sVar257 - sVar277,uVar245)) >> 0x20);
              auVar208._8_4_ = auVar79._0_4_;
              auVar208._12_4_ = uVar258;
              auVar207._4_8_ = auVar208._8_8_;
              auVar207._0_4_ = uVar245;
              auVar207._12_4_ = 0;
              auVar179._4_4_ = uVar258 >> 0x10;
              auVar179._0_4_ = auVar279._4_4_;
              auVar179._8_8_ = 0;
              auVar265._8_4_ = auVar261._4_4_;
              auVar265._12_4_ = uVar258;
              auVar239._4_8_ = auVar265._8_8_;
              auVar239._0_4_ = uVar258;
              auVar239._12_4_ = 0;
              auVar210._0_12_ = SUB1612(auVar207 << 0x20,0);
              auVar210._12_2_ = sVar256;
              auVar210._14_2_ = auVar247._6_2_;
              auVar209._12_4_ = auVar210._12_4_;
              auVar209._0_10_ = SUB1610(auVar207 << 0x20,0);
              auVar209._10_2_ = auVar247._4_2_;
              auVar116._4_2_ = sVar205 - sVar274;
              auVar116._0_4_ = uVar245;
              auVar116._6_6_ = auVar209._10_6_;
              auVar80._4_8_ = auVar116._4_8_;
              auVar80._2_2_ = auVar247._2_2_;
              auVar80._0_2_ = auVar276._0_2_;
              auVar211._2_2_ = auVar247._0_2_;
              auVar211._8_4_ = auVar116._4_4_;
              auVar211._4_4_ = auVar209._12_4_;
              auVar211._12_4_ = auVar80._0_4_;
              auVar207 = pshufhw(auVar211,auVar211,0xe8);
              auVar212._0_4_ = auVar207._0_4_;
              auVar212._8_4_ = auVar207._8_4_;
              auVar212._12_4_ = auVar207._12_4_;
              auVar212._4_4_ = auVar212._8_4_;
              auVar207 = pshuflw(auVar212,auVar212,0x6c);
              auVar281._0_12_ = SUB1612(auVar179 << 0x40,0);
              auVar281._12_2_ = 0;
              auVar281._14_2_ = auVar247._6_2_;
              auVar280._12_4_ = auVar281._12_4_;
              auVar280._0_10_ = SUB1610(auVar179 << 0x40,0);
              auVar280._10_2_ = auVar247._4_2_;
              uVar82 = CONCAT62(auVar280._10_6_,sVar256);
              auVar81._4_8_ = uVar82;
              auVar81._2_2_ = auVar247._2_2_;
              auVar81._0_2_ = auVar279._2_2_;
              auVar248._14_2_ = auVar247._0_2_;
              auVar248._12_2_ = auVar279._0_2_;
              auVar248._4_4_ = auVar81._0_4_;
              auVar248._0_4_ = auVar280._12_4_;
              auVar248._8_4_ = (int)uVar82;
              auVar179 = pshufhw(auVar248,auVar248,0xe8);
              auVar249._4_4_ = auVar179._4_4_;
              auVar249._8_4_ = auVar179._8_4_;
              auVar249._12_4_ = auVar179._12_4_;
              auVar249._0_4_ = auVar249._8_4_;
              in_XMM5 = pshuflw(auVar249,auVar249,0xc9);
              auVar268._0_12_ = SUB1612(auVar239 << 0x20,0);
              auVar268._12_2_ = sVar259;
              auVar268._14_2_ = auVar247._6_2_;
              auVar267._12_4_ = auVar268._12_4_;
              auVar267._0_10_ = SUB1610(auVar239 << 0x20,0);
              auVar267._10_2_ = auVar247._4_2_;
              auVar117._4_2_ = sVar257 - sVar277;
              auVar117._0_4_ = uVar258;
              auVar117._6_6_ = auVar267._10_6_;
              auVar266._8_8_ = auVar117._4_8_;
              auVar266._6_2_ = auVar247._2_2_;
              auVar266._4_2_ = auVar276._4_2_;
              auVar266._2_2_ = auVar247._0_2_;
              auVar266._0_2_ = sVar232;
              auVar179 = pshuflw(auVar266,auVar266,0xe8);
              in_XMM4 = ZEXT616(CONCAT24(sVar259,uVar237)) & auVar214;
              auVar239 = ~auVar214 & auVar247 | in_XMM4;
              sVar257 = auVar179._0_2_;
              sVar259 = auVar179._2_2_;
              sVar274 = auVar179._8_2_;
              sVar275 = auVar179._10_2_;
              in_XMM3._0_8_ =
                   (void *)CONCAT26(auVar207._6_2_ - sVar275,
                                    CONCAT24(auVar207._4_2_ - sVar274,
                                             CONCAT22(auVar207._2_2_ - sVar259,
                                                      auVar207._0_2_ - sVar257)));
              in_XMM3._8_2_ = auVar207._8_2_ - sVar274;
              in_XMM3._10_2_ = auVar207._10_2_ - sVar275;
              in_XMM3._12_2_ = auVar207._12_2_ - auVar179._12_2_;
              in_XMM3._14_2_ = auVar207._14_2_ - auVar179._14_2_;
              top_blob_bordered.data = in_XMM3._0_8_;
              sVar232 = in_XMM5._0_2_;
              sVar233 = in_XMM5._2_2_;
              d1[1] = sVar233 + sVar259;
              d1[0] = sVar232 + sVar257;
              sVar205 = in_XMM5._4_2_;
              d1[2] = sVar205 + sVar274;
              sVar256 = in_XMM5._6_2_;
              d1[3] = sVar256 + sVar275;
              d2[1] = sVar259 - sVar233;
              d2[0] = sVar257 - sVar232;
              d2[2] = sVar274 - sVar205;
              d2[3] = sVar275 - sVar256;
              d3[1] = auVar239._2_2_ - sVar233;
              d3[0] = auVar239._0_2_ - sVar232;
              d3[2] = auVar239._4_2_ - sVar205;
              d3[3] = auVar239._6_2_ - sVar256;
              aiStack_e0 = auVar161._8_8_;
              lVar141 = 0;
              do {
                *(undefined2 *)((long)pvVar157 + lVar141) =
                     *(undefined2 *)((long)&top_blob_bordered.data + lVar141);
                *(undefined2 *)((long)pvVar157 + lVar141 + 8) = *(undefined2 *)((long)d1 + lVar141);
                *(undefined2 *)((long)pvVar157 + lVar141 + 0x10) =
                     *(undefined2 *)((long)d2 + lVar141);
                *(undefined2 *)((long)pvVar157 + lVar141 + 0x18) =
                     *(undefined2 *)((long)d3 + lVar141);
                lVar141 = lVar141 + 2;
              } while (lVar141 != 8);
              puVar154 = (undefined4 *)((long)puVar154 + 2);
              puVar134 = (undefined4 *)((long)puVar134 + 2);
              puVar124 = (undefined4 *)((long)puVar124 + 2);
              puVar147 = (undefined4 *)((long)puVar147 + 2);
              pvVar157 = (void *)((long)pvVar157 + 0x20);
              uVar126 = uVar126 + 1;
            } while (uVar126 != uVar122);
          }
          uVar151 = uVar151 + 1;
        } while (uVar151 != uVar146);
      }
      uVar149 = uVar149 + 1;
    } while (uVar149 != uVar131);
  }
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  piVar3 = (int *)CONCAT44(local_218._12_4_,local_218._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_218._32_8_ == (Allocator *)0x0) {
        if ((void *)local_218._0_8_ != (void *)0x0) {
          free((void *)local_218._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_218._32_8_ + 0x18))();
      }
    }
  }
  piVar3 = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
  local_218._0_8_ = top_blob_bordered.data;
  local_218._8_4_ = top_blob_bordered.refcount._0_4_;
  local_218._12_4_ = top_blob_bordered.refcount._4_4_;
  local_218._16_8_ = top_blob_bordered.elemsize;
  local_218._24_4_ = top_blob_bordered.elempack;
  local_218._32_8_ = top_blob_bordered.allocator;
  local_218._44_4_ = top_blob_bordered.w;
  local_218._40_4_ = top_blob_bordered.dims;
  uStack_1e8._4_4_ = top_blob_bordered.c;
  uStack_1e8._0_4_ = top_blob_bordered.h;
  local_1e0 = top_blob_bordered.cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (**(code **)(*(long *)top_blob_bordered.allocator + 0x18))();
      }
    }
  }
  local_1c8 = (ulong)(int)uVar2;
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  local_1d8 = local_1d0->workspace_allocator;
  lVar155 = (uVar127 & 0x3ffffffffffffff0) * local_1c8;
  if (lVar155 == 0) {
    local_2a0 = (int *)0x0;
    local_2f8 = (void *)0x0;
  }
  else {
    sVar138 = lVar155 * 4 + 4;
    if (local_1d8 == (Allocator *)0x0) {
      top_blob_bordered.data = (void *)0x0;
      iVar145 = posix_memalign(&top_blob_bordered.data,0x10,sVar138);
      if (iVar145 != 0) {
        top_blob_bordered.data = (void *)0x0;
      }
    }
    else {
      top_blob_bordered.data = (void *)(**(code **)(*(long *)local_1d8 + 0x10))(local_1d8,sVar138);
    }
    local_2a0 = (int *)((long)top_blob_bordered.data + lVar155 * 4);
    *(undefined4 *)((long)top_blob_bordered.data + lVar155 * 4) = 1;
    local_2f8 = top_blob_bordered.data;
  }
  uVar122 = (int)local_1c8 >> 2;
  local_1b0 = local_1c8 & 0xfffffffffffffffc;
  local_180 = (void *)(ulong)uVar125;
  pvVar157 = local_180;
  if (0 < (int)uVar122) {
    local_298 = kernel_tm->data;
    local_88 = kernel_tm->elemsize;
    local_1b8 = (void *)(ulong)uVar122;
    lVar155 = uVar127 * 8;
    lVar141 = kernel_tm->cstep * local_88;
    local_1c0 = lVar141 * 4;
    local_90 = local_88 * 4;
    local_190 = (void *)((long)local_2f0 + uVar127 * 2);
    local_198 = (void *)((long)local_2f0 + uVar127 * 4);
    local_1a0 = (void *)((long)local_2f0 + uVar127 * 6);
    local_230 = (void *)((long)local_298 + lVar141);
    local_238 = (void *)(lVar141 * 3 + (long)local_298);
    local_2b0 = (void *)((long)local_2f8 + uVar127 * 0xc);
    local_80 = uVar127 * 0x10;
    local_240 = (void *)((long)local_298 + lVar141 * 2);
    local_248 = (void *)((long)local_2f8 + uVar127 * 8);
    local_250 = (void *)((long)local_2f8 + uVar127 * 4);
    local_258 = local_2f8;
    pvVar157 = (void *)0x0;
    do {
      local_1a8 = pvVar157;
      if (0 < (int)uVar125) {
        iVar145 = kernel_tm->w;
        lVar156 = (long)iVar145 * local_88;
        pvVar150 = (void *)0x0;
        pvVar157 = local_2b0;
        pvVar139 = local_258;
        pvVar142 = local_250;
        pvVar143 = local_248;
        do {
          uVar149 = (ulong)(uint)((int)pvVar150 << 5);
          uVar146 = 0;
          top_blob_bordered.h = 0;
          top_blob_bordered.c = 0;
          top_blob_bordered.cstep = 0;
          top_blob_bordered.allocator = (Allocator *)0x0;
          top_blob_bordered.dims = 0;
          top_blob_bordered.w = 0;
          top_blob_bordered.elemsize = 0;
          top_blob_bordered.elempack = 0;
          top_blob_bordered._28_4_ = 0;
          top_blob_bordered.data = (void *)0x0;
          top_blob_bordered.refcount._0_4_ = 0;
          top_blob_bordered.refcount._4_4_ = 0;
          local_148 = (undefined1  [16])0x0;
          local_158 = (undefined1  [16])0x0;
          local_168 = (undefined1  [16])0x0;
          _d1 = (undefined1  [16])0x0;
          local_108 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          local_128 = (undefined1  [16])0x0;
          _d2 = (undefined1  [16])0x0;
          local_b8 = (undefined1  [16])0x0;
          local_c8 = (undefined1  [16])0x0;
          local_d8 = (undefined1  [16])0x0;
          _d3 = (undefined1  [16])0x0;
          if (3 < (int)uVar78) {
            lVar129 = (long)local_2f0 + uVar149;
            lVar158 = (long)local_190 + uVar149;
            lVar128 = (long)local_198 + uVar149;
            lVar152 = (long)local_1a0 + uVar149;
            pvVar135 = local_298;
            uVar151 = 0;
            do {
              lVar132 = 0;
              do {
                uVar146 = *(ulong *)(lVar129 + lVar132);
                uVar176 = (undefined2)(uVar146 >> 0x30);
                auVar214._8_4_ = 0;
                auVar214._0_8_ = uVar146;
                auVar214._12_2_ = uVar176;
                auVar214._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar146 >> 0x20);
                auVar165._12_4_ = auVar214._12_4_;
                auVar165._8_2_ = 0;
                auVar165._0_8_ = uVar146;
                auVar165._10_2_ = uVar176;
                auVar164._10_6_ = auVar165._10_6_;
                auVar164._8_2_ = uVar176;
                auVar164._0_8_ = uVar146;
                uVar176 = (undefined2)(uVar146 >> 0x10);
                auVar83._4_8_ = auVar164._8_8_;
                auVar83._2_2_ = uVar176;
                auVar83._0_2_ = uVar176;
                auVar166._0_4_ = (int)(short)uVar146;
                auVar166._4_4_ = auVar83._0_4_ >> 0x10;
                auVar166._8_4_ = auVar164._8_4_ >> 0x10;
                auVar166._12_4_ = auVar165._12_4_ >> 0x10;
                uVar146 = *(ulong *)((long)pvVar135 + lVar132);
                auVar9._8_4_ = 0;
                auVar9._0_8_ = uVar146;
                auVar9._12_2_ = (short)(uVar146 >> 0x30);
                auVar32._8_2_ = (short)(uVar146 >> 0x20);
                auVar32._0_8_ = uVar146;
                auVar32._10_4_ = auVar9._10_4_;
                auVar84._6_8_ = 0;
                auVar84._0_6_ = auVar32._8_6_;
                auVar68._4_2_ = (short)(uVar146 >> 0x10);
                auVar68._0_4_ = (uint)uVar146;
                auVar68._6_8_ = SUB148(auVar84 << 0x40,6);
                auVar213._0_4_ = (uint)uVar146 & 0xffff;
                auVar213._4_10_ = auVar68._4_10_;
                auVar213._14_2_ = 0;
                auVar214 = pmaddwd(auVar213,auVar166);
                lVar153 = lVar132 * 2;
                iVar163 = auVar214._0_4_ + *(int *)((long)&top_blob_bordered.data + lVar153);
                iVar177 = auVar214._4_4_ + *(int *)((long)&top_blob_bordered.data + lVar153 + 4);
                iVar234 = auVar214._8_4_ + *(int *)((long)&top_blob_bordered.refcount + lVar153);
                iVar236 = auVar214._12_4_ +
                          *(int *)((long)&top_blob_bordered.refcount + lVar153 + 4);
                lVar153 = lVar132 * 2;
                *(int *)((long)&top_blob_bordered.data + lVar153) = iVar163;
                *(int *)((long)&top_blob_bordered.data + lVar153 + 4) = iVar177;
                *(int *)((long)&top_blob_bordered.refcount + lVar153) = iVar234;
                *(int *)((long)&top_blob_bordered.refcount + lVar153 + 4) = iVar236;
                uVar146 = *(ulong *)(lVar158 + lVar132);
                uVar176 = (undefined2)(uVar146 >> 0x30);
                auVar182._8_4_ = 0;
                auVar182._0_8_ = uVar146;
                auVar182._12_2_ = uVar176;
                auVar182._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar146 >> 0x20);
                auVar181._12_4_ = auVar182._12_4_;
                auVar181._8_2_ = 0;
                auVar181._0_8_ = uVar146;
                auVar181._10_2_ = uVar176;
                auVar180._10_6_ = auVar181._10_6_;
                auVar180._8_2_ = uVar176;
                auVar180._0_8_ = uVar146;
                uVar176 = (undefined2)(uVar146 >> 0x10);
                auVar85._4_8_ = auVar180._8_8_;
                auVar85._2_2_ = uVar176;
                auVar85._0_2_ = uVar176;
                auVar183._0_4_ = (int)(short)uVar146;
                auVar183._4_4_ = auVar85._0_4_ >> 0x10;
                auVar183._8_4_ = auVar180._8_4_ >> 0x10;
                auVar183._12_4_ = auVar181._12_4_ >> 0x10;
                uVar146 = *(ulong *)((long)pvVar135 + lVar132 + 0x20);
                auVar10._8_4_ = 0;
                auVar10._0_8_ = uVar146;
                auVar10._12_2_ = (short)(uVar146 >> 0x30);
                auVar33._8_2_ = (short)(uVar146 >> 0x20);
                auVar33._0_8_ = uVar146;
                auVar33._10_4_ = auVar10._10_4_;
                auVar86._6_8_ = 0;
                auVar86._0_6_ = auVar33._8_6_;
                auVar69._4_2_ = (short)(uVar146 >> 0x10);
                auVar69._0_4_ = (uint)uVar146;
                auVar69._6_8_ = SUB148(auVar86 << 0x40,6);
                auVar240._0_4_ = (uint)uVar146 & 0xffff;
                auVar240._4_10_ = auVar69._4_10_;
                auVar240._14_2_ = 0;
                auVar214 = pmaddwd(auVar240,auVar183);
                iVar163 = auVar214._0_4_ + iVar163;
                iVar177 = auVar214._4_4_ + iVar177;
                iVar234 = auVar214._8_4_ + iVar234;
                iVar236 = auVar214._12_4_ + iVar236;
                lVar153 = lVar132 * 2;
                *(int *)((long)&top_blob_bordered.data + lVar153) = iVar163;
                *(int *)((long)&top_blob_bordered.data + lVar153 + 4) = iVar177;
                *(int *)((long)&top_blob_bordered.refcount + lVar153) = iVar234;
                *(int *)((long)&top_blob_bordered.refcount + lVar153 + 4) = iVar236;
                uVar146 = *(ulong *)(lVar128 + lVar132);
                uVar176 = (undefined2)(uVar146 >> 0x30);
                auVar217._8_4_ = 0;
                auVar217._0_8_ = uVar146;
                auVar217._12_2_ = uVar176;
                auVar217._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar146 >> 0x20);
                auVar216._12_4_ = auVar217._12_4_;
                auVar216._8_2_ = 0;
                auVar216._0_8_ = uVar146;
                auVar216._10_2_ = uVar176;
                auVar215._10_6_ = auVar216._10_6_;
                auVar215._8_2_ = uVar176;
                auVar215._0_8_ = uVar146;
                uVar176 = (undefined2)(uVar146 >> 0x10);
                auVar87._4_8_ = auVar215._8_8_;
                auVar87._2_2_ = uVar176;
                auVar87._0_2_ = uVar176;
                auVar218._0_4_ = (int)(short)uVar146;
                auVar218._4_4_ = auVar87._0_4_ >> 0x10;
                auVar218._8_4_ = auVar215._8_4_ >> 0x10;
                auVar218._12_4_ = auVar216._12_4_ >> 0x10;
                uVar146 = *(ulong *)((long)pvVar135 + lVar132 + 0x40);
                auVar11._8_4_ = 0;
                auVar11._0_8_ = uVar146;
                auVar11._12_2_ = (short)(uVar146 >> 0x30);
                auVar34._8_2_ = (short)(uVar146 >> 0x20);
                auVar34._0_8_ = uVar146;
                auVar34._10_4_ = auVar11._10_4_;
                auVar88._6_8_ = 0;
                auVar88._0_6_ = auVar34._8_6_;
                auVar250._6_8_ = SUB148(auVar88 << 0x40,6);
                auVar250._4_2_ = (short)(uVar146 >> 0x10);
                auVar250._0_2_ = (ushort)uVar146;
                auVar250._2_2_ = 0;
                auVar250._14_2_ = 0;
                auVar214 = pmaddwd(auVar250,auVar218);
                iVar163 = auVar214._0_4_ + iVar163;
                iVar177 = auVar214._4_4_ + iVar177;
                iVar234 = auVar214._8_4_ + iVar234;
                iVar236 = auVar214._12_4_ + iVar236;
                lVar153 = lVar132 * 2;
                *(int *)((long)&top_blob_bordered.data + lVar153) = iVar163;
                *(int *)((long)&top_blob_bordered.data + lVar153 + 4) = iVar177;
                *(int *)((long)&top_blob_bordered.refcount + lVar153) = iVar234;
                *(int *)((long)&top_blob_bordered.refcount + lVar153 + 4) = iVar236;
                uVar146 = *(ulong *)(lVar152 + lVar132);
                uVar176 = (undefined2)(uVar146 >> 0x30);
                auVar243._8_4_ = 0;
                auVar243._0_8_ = uVar146;
                auVar243._12_2_ = uVar176;
                auVar243._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar146 >> 0x20);
                auVar242._12_4_ = auVar243._12_4_;
                auVar242._8_2_ = 0;
                auVar242._0_8_ = uVar146;
                auVar242._10_2_ = uVar176;
                auVar241._10_6_ = auVar242._10_6_;
                auVar241._8_2_ = uVar176;
                auVar241._0_8_ = uVar146;
                uVar176 = (undefined2)(uVar146 >> 0x10);
                auVar89._4_8_ = auVar241._8_8_;
                auVar89._2_2_ = uVar176;
                auVar89._0_2_ = uVar176;
                auVar244._0_4_ = (int)(short)uVar146;
                auVar244._4_4_ = auVar89._0_4_ >> 0x10;
                auVar244._8_4_ = auVar241._8_4_ >> 0x10;
                auVar244._12_4_ = auVar242._12_4_ >> 0x10;
                uVar146 = *(ulong *)((long)pvVar135 + lVar132 + 0x60);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar146;
                auVar12._12_2_ = (short)(uVar146 >> 0x30);
                auVar35._8_2_ = (short)(uVar146 >> 0x20);
                auVar35._0_8_ = uVar146;
                auVar35._10_4_ = auVar12._10_4_;
                auVar90._6_8_ = 0;
                auVar90._0_6_ = auVar35._8_6_;
                auVar269._6_8_ = SUB148(auVar90 << 0x40,6);
                auVar269._4_2_ = (short)(uVar146 >> 0x10);
                auVar269._0_2_ = (ushort)uVar146;
                auVar269._2_2_ = 0;
                auVar269._14_2_ = 0;
                auVar214 = pmaddwd(auVar269,auVar244);
                lVar153 = lVar132 * 2;
                *(int *)((long)&top_blob_bordered.data + lVar153) = auVar214._0_4_ + iVar163;
                *(int *)((long)&top_blob_bordered.data + lVar153 + 4) = auVar214._4_4_ + iVar177;
                *(int *)((long)&top_blob_bordered.refcount + lVar153) = auVar214._8_4_ + iVar234;
                *(int *)((long)&top_blob_bordered.refcount + lVar153 + 4) =
                     auVar214._12_4_ + iVar236;
                lVar153 = lVar141 + lVar132;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + lVar132);
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar146;
                auVar13._12_2_ = (short)(uVar146 >> 0x30);
                auVar36._8_2_ = (short)(uVar146 >> 0x20);
                auVar36._0_8_ = uVar146;
                auVar36._10_4_ = auVar13._10_4_;
                auVar91._6_8_ = 0;
                auVar91._0_6_ = auVar36._8_6_;
                auVar251._6_8_ = SUB148(auVar91 << 0x40,6);
                auVar251._4_2_ = (short)(uVar146 >> 0x10);
                auVar251._0_2_ = (ushort)uVar146;
                auVar251._2_2_ = 0;
                auVar251._14_2_ = 0;
                auVar214 = pmaddwd(auVar251,auVar166);
                iVar163 = auVar214._0_4_ + *(int *)(d1 + lVar132);
                iVar177 = auVar214._4_4_ + *(int *)(d1 + lVar132 + 2);
                iVar234 = auVar214._8_4_ + *(int *)(local_168 + lVar132 * 2 + -8);
                iVar236 = auVar214._12_4_ + *(int *)(local_168 + lVar132 * 2 + -4);
                *(int *)(d1 + lVar132) = iVar163;
                *(int *)(d1 + lVar132 + 2) = iVar177;
                *(int *)(local_168 + lVar132 * 2 + -8) = iVar234;
                *(int *)(local_168 + lVar132 * 2 + -4) = iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x20 + lVar132);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar146;
                auVar14._12_2_ = (short)(uVar146 >> 0x30);
                auVar37._8_2_ = (short)(uVar146 >> 0x20);
                auVar37._0_8_ = uVar146;
                auVar37._10_4_ = auVar14._10_4_;
                auVar92._6_8_ = 0;
                auVar92._0_6_ = auVar37._8_6_;
                auVar270._6_8_ = SUB148(auVar92 << 0x40,6);
                auVar270._4_2_ = (short)(uVar146 >> 0x10);
                auVar270._0_2_ = (ushort)uVar146;
                auVar270._2_2_ = 0;
                auVar270._14_2_ = 0;
                auVar214 = pmaddwd(auVar270,auVar183);
                iVar163 = auVar214._0_4_ + iVar163;
                iVar177 = auVar214._4_4_ + iVar177;
                iVar234 = auVar214._8_4_ + iVar234;
                iVar236 = auVar214._12_4_ + iVar236;
                *(int *)(d1 + lVar132) = iVar163;
                *(int *)(d1 + lVar132 + 2) = iVar177;
                *(int *)(local_168 + lVar132 * 2 + -8) = iVar234;
                *(int *)(local_168 + lVar132 * 2 + -4) = iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x40 + lVar132);
                auVar15._8_4_ = 0;
                auVar15._0_8_ = uVar146;
                auVar15._12_2_ = (short)(uVar146 >> 0x30);
                auVar38._8_2_ = (short)(uVar146 >> 0x20);
                auVar38._0_8_ = uVar146;
                auVar38._10_4_ = auVar15._10_4_;
                auVar93._6_8_ = 0;
                auVar93._0_6_ = auVar38._8_6_;
                auVar252._6_8_ = SUB148(auVar93 << 0x40,6);
                auVar252._4_2_ = (short)(uVar146 >> 0x10);
                auVar252._0_2_ = (ushort)uVar146;
                auVar252._2_2_ = 0;
                auVar252._14_2_ = 0;
                auVar214 = pmaddwd(auVar252,auVar218);
                iVar163 = auVar214._0_4_ + iVar163;
                iVar177 = auVar214._4_4_ + iVar177;
                iVar234 = auVar214._8_4_ + iVar234;
                iVar236 = auVar214._12_4_ + iVar236;
                *(int *)(d1 + lVar132) = iVar163;
                *(int *)(d1 + lVar132 + 2) = iVar177;
                *(int *)(local_168 + lVar132 * 2 + -8) = iVar234;
                *(int *)(local_168 + lVar132 * 2 + -4) = iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x60 + lVar132);
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar146;
                auVar16._12_2_ = (short)(uVar146 >> 0x30);
                auVar39._8_2_ = (short)(uVar146 >> 0x20);
                auVar39._0_8_ = uVar146;
                auVar39._10_4_ = auVar16._10_4_;
                auVar94._6_8_ = 0;
                auVar94._0_6_ = auVar39._8_6_;
                auVar271._6_8_ = SUB148(auVar94 << 0x40,6);
                auVar271._4_2_ = (short)(uVar146 >> 0x10);
                auVar271._0_2_ = (ushort)uVar146;
                auVar271._2_2_ = 0;
                auVar271._14_2_ = 0;
                auVar214 = pmaddwd(auVar271,auVar244);
                *(int *)(d1 + lVar132) = auVar214._0_4_ + iVar163;
                *(int *)(d1 + lVar132 + 2) = auVar214._4_4_ + iVar177;
                *(int *)(local_168 + lVar132 * 2 + -8) = auVar214._8_4_ + iVar234;
                *(int *)(local_168 + lVar132 * 2 + -4) = auVar214._12_4_ + iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + lVar153);
                auVar17._8_4_ = 0;
                auVar17._0_8_ = uVar146;
                auVar17._12_2_ = (short)(uVar146 >> 0x30);
                auVar40._8_2_ = (short)(uVar146 >> 0x20);
                auVar40._0_8_ = uVar146;
                auVar40._10_4_ = auVar17._10_4_;
                auVar95._6_8_ = 0;
                auVar95._0_6_ = auVar40._8_6_;
                auVar253._6_8_ = SUB148(auVar95 << 0x40,6);
                auVar253._4_2_ = (short)(uVar146 >> 0x10);
                auVar253._0_2_ = (ushort)uVar146;
                auVar253._2_2_ = 0;
                auVar253._14_2_ = 0;
                auVar214 = pmaddwd(auVar253,auVar166);
                iVar163 = auVar214._0_4_ + *(int *)(d2 + lVar132);
                iVar177 = auVar214._4_4_ + *(int *)(d2 + lVar132 + 2);
                iVar234 = auVar214._8_4_ + *(int *)((long)aiStack_130 + lVar132 * 2);
                iVar236 = auVar214._12_4_ + *(int *)(local_128 + lVar132 * 2 + -4);
                lVar140 = lVar141 + lVar153;
                *(int *)(d2 + lVar132) = iVar163;
                *(int *)(d2 + lVar132 + 2) = iVar177;
                *(int *)((long)aiStack_130 + lVar132 * 2) = iVar234;
                *(int *)(local_128 + lVar132 * 2 + -4) = iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x20 + lVar153);
                auVar18._8_4_ = 0;
                auVar18._0_8_ = uVar146;
                auVar18._12_2_ = (short)(uVar146 >> 0x30);
                auVar41._8_2_ = (short)(uVar146 >> 0x20);
                auVar41._0_8_ = uVar146;
                auVar41._10_4_ = auVar18._10_4_;
                auVar96._6_8_ = 0;
                auVar96._0_6_ = auVar41._8_6_;
                auVar272._6_8_ = SUB148(auVar96 << 0x40,6);
                auVar272._4_2_ = (short)(uVar146 >> 0x10);
                auVar272._0_2_ = (ushort)uVar146;
                auVar272._2_2_ = 0;
                auVar272._14_2_ = 0;
                auVar214 = pmaddwd(auVar272,auVar183);
                iVar163 = auVar214._0_4_ + iVar163;
                iVar177 = auVar214._4_4_ + iVar177;
                iVar234 = auVar214._8_4_ + iVar234;
                iVar236 = auVar214._12_4_ + iVar236;
                *(int *)(d2 + lVar132) = iVar163;
                *(int *)(d2 + lVar132 + 2) = iVar177;
                *(int *)((long)aiStack_130 + lVar132 * 2) = iVar234;
                *(int *)(local_128 + lVar132 * 2 + -4) = iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x40 + lVar153);
                auVar19._8_4_ = 0;
                auVar19._0_8_ = uVar146;
                auVar19._12_2_ = (short)(uVar146 >> 0x30);
                auVar42._8_2_ = (short)(uVar146 >> 0x20);
                auVar42._0_8_ = uVar146;
                auVar42._10_4_ = auVar19._10_4_;
                auVar97._6_8_ = 0;
                auVar97._0_6_ = auVar42._8_6_;
                auVar254._6_8_ = SUB148(auVar97 << 0x40,6);
                auVar254._4_2_ = (short)(uVar146 >> 0x10);
                auVar254._0_2_ = (ushort)uVar146;
                auVar254._2_2_ = 0;
                auVar254._14_2_ = 0;
                auVar214 = pmaddwd(auVar254,auVar218);
                iVar163 = auVar214._0_4_ + iVar163;
                iVar177 = auVar214._4_4_ + iVar177;
                iVar234 = auVar214._8_4_ + iVar234;
                iVar236 = auVar214._12_4_ + iVar236;
                *(int *)(d2 + lVar132) = iVar163;
                *(int *)(d2 + lVar132 + 2) = iVar177;
                *(int *)((long)aiStack_130 + lVar132 * 2) = iVar234;
                *(int *)(local_128 + lVar132 * 2 + -4) = iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x60 + lVar153);
                auVar20._8_4_ = 0;
                auVar20._0_8_ = uVar146;
                auVar20._12_2_ = (short)(uVar146 >> 0x30);
                auVar43._8_2_ = (short)(uVar146 >> 0x20);
                auVar43._0_8_ = uVar146;
                auVar43._10_4_ = auVar20._10_4_;
                auVar98._6_8_ = 0;
                auVar98._0_6_ = auVar43._8_6_;
                auVar273._6_8_ = SUB148(auVar98 << 0x40,6);
                auVar273._4_2_ = (short)(uVar146 >> 0x10);
                auVar273._0_2_ = (ushort)uVar146;
                auVar273._2_2_ = 0;
                auVar273._14_2_ = 0;
                auVar214 = pmaddwd(auVar273,auVar244);
                *(int *)(d2 + lVar132) = auVar214._0_4_ + iVar163;
                *(int *)(d2 + lVar132 + 2) = auVar214._4_4_ + iVar177;
                *(int *)((long)aiStack_130 + lVar132 * 2) = auVar214._8_4_ + iVar234;
                *(int *)(local_128 + lVar132 * 2 + -4) = auVar214._12_4_ + iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + lVar140);
                auVar21._8_4_ = 0;
                auVar21._0_8_ = uVar146;
                auVar21._12_2_ = (short)(uVar146 >> 0x30);
                auVar44._8_2_ = (short)(uVar146 >> 0x20);
                auVar44._0_8_ = uVar146;
                auVar44._10_4_ = auVar21._10_4_;
                auVar99._6_8_ = 0;
                auVar99._0_6_ = auVar44._8_6_;
                auVar255._6_8_ = SUB148(auVar99 << 0x40,6);
                auVar255._4_2_ = (short)(uVar146 >> 0x10);
                auVar255._0_2_ = (ushort)uVar146;
                auVar255._2_2_ = 0;
                auVar255._14_2_ = 0;
                auVar214 = pmaddwd(auVar255,auVar166);
                iVar163 = auVar214._0_4_ + *(int *)(d3 + lVar132);
                iVar177 = auVar214._4_4_ + *(int *)(d3 + lVar132 + 2);
                iVar234 = auVar214._8_4_ + *(int *)((long)aiStack_e0 + lVar132 * 2);
                iVar236 = auVar214._12_4_ + *(int *)(local_d8 + lVar132 * 2 + -4);
                *(int *)(d3 + lVar132) = iVar163;
                *(int *)(d3 + lVar132 + 2) = iVar177;
                *(int *)((long)aiStack_e0 + lVar132 * 2) = iVar234;
                *(int *)(local_d8 + lVar132 * 2 + -4) = iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x20 + lVar140);
                auVar22._8_4_ = 0;
                auVar22._0_8_ = uVar146;
                auVar22._12_2_ = (short)(uVar146 >> 0x30);
                auVar45._8_2_ = (short)(uVar146 >> 0x20);
                auVar45._0_8_ = uVar146;
                auVar45._10_4_ = auVar22._10_4_;
                auVar100._6_8_ = 0;
                auVar100._0_6_ = auVar45._8_6_;
                auVar167._6_8_ = SUB148(auVar100 << 0x40,6);
                auVar167._4_2_ = (short)(uVar146 >> 0x10);
                auVar167._0_2_ = (ushort)uVar146;
                auVar167._2_2_ = 0;
                auVar167._14_2_ = 0;
                auVar214 = pmaddwd(auVar167,auVar183);
                iVar163 = auVar214._0_4_ + iVar163;
                iVar177 = auVar214._4_4_ + iVar177;
                iVar234 = auVar214._8_4_ + iVar234;
                iVar236 = auVar214._12_4_ + iVar236;
                *(int *)(d3 + lVar132) = iVar163;
                *(int *)(d3 + lVar132 + 2) = iVar177;
                *(int *)((long)aiStack_e0 + lVar132 * 2) = iVar234;
                *(int *)(local_d8 + lVar132 * 2 + -4) = iVar236;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x40 + lVar140);
                auVar23._8_4_ = 0;
                auVar23._0_8_ = uVar146;
                auVar23._12_2_ = (short)(uVar146 >> 0x30);
                auVar46._8_2_ = (short)(uVar146 >> 0x20);
                auVar46._0_8_ = uVar146;
                auVar46._10_4_ = auVar23._10_4_;
                auVar101._6_8_ = 0;
                auVar101._0_6_ = auVar46._8_6_;
                auVar184._6_8_ = SUB148(auVar101 << 0x40,6);
                auVar184._4_2_ = (short)(uVar146 >> 0x10);
                auVar184._0_2_ = (ushort)uVar146;
                auVar184._2_2_ = 0;
                auVar184._14_2_ = 0;
                auVar214 = pmaddwd(auVar184,auVar218);
                auVar185._0_4_ = auVar214._0_4_ + iVar163;
                auVar185._4_4_ = auVar214._4_4_ + iVar177;
                auVar185._8_4_ = auVar214._8_4_ + iVar234;
                auVar185._12_4_ = auVar214._12_4_ + iVar236;
                *(undefined1 (*) [16])(d3 + lVar132) = auVar185;
                uVar146 = *(ulong *)((long)pvVar135 + lVar141 + 0x60 + lVar140);
                auVar24._8_4_ = 0;
                auVar24._0_8_ = uVar146;
                auVar24._12_2_ = (short)(uVar146 >> 0x30);
                auVar47._8_2_ = (short)(uVar146 >> 0x20);
                auVar47._0_8_ = uVar146;
                auVar47._10_4_ = auVar24._10_4_;
                auVar102._6_8_ = 0;
                auVar102._0_6_ = auVar47._8_6_;
                auVar168._6_8_ = SUB148(auVar102 << 0x40,6);
                auVar168._4_2_ = (short)(uVar146 >> 0x10);
                auVar168._0_2_ = (ushort)uVar146;
                auVar168._2_2_ = 0;
                auVar168._14_2_ = 0;
                auVar214 = pmaddwd(auVar168,auVar244);
                *(int *)(d3 + lVar132) = auVar214._0_4_ + auVar185._0_4_;
                *(int *)(d3 + lVar132 + 2) = auVar214._4_4_ + auVar185._4_4_;
                *(int *)((long)aiStack_e0 + lVar132 * 2) = auVar214._8_4_ + auVar185._8_4_;
                *(int *)(local_d8 + lVar132 * 2 + -4) = auVar214._12_4_ + auVar185._12_4_;
                lVar132 = lVar132 + 8;
              } while (lVar132 != 0x20);
              uVar146 = uVar151 + 4;
              lVar132 = uVar151 + 7;
              lVar129 = lVar129 + lVar155;
              pvVar135 = (void *)((long)pvVar135 + local_90 * iVar145);
              lVar158 = lVar158 + lVar155;
              lVar128 = lVar128 + lVar155;
              lVar152 = lVar152 + lVar155;
              uVar151 = uVar146;
            } while (lVar132 < lVar123);
          }
          if ((int)uVar146 < (int)uVar78) {
            uVar146 = uVar146 & 0xffffffff;
            lVar158 = (long)local_2f0 + uVar127 * 2 * uVar146 + uVar149;
            lVar129 = lVar156 * uVar146;
            pvVar135 = (void *)((long)local_298 + lVar129);
            pvVar133 = (void *)((long)local_230 + lVar129);
            pvVar159 = (void *)((long)local_240 + lVar129);
            pvVar130 = (void *)(lVar129 + (long)local_238);
            do {
              lVar129 = 0;
              do {
                uVar149 = *(ulong *)(lVar158 + lVar129);
                uVar176 = (undefined2)(uVar149 >> 0x30);
                auVar171._8_4_ = 0;
                auVar171._0_8_ = uVar149;
                auVar171._12_2_ = uVar176;
                auVar171._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar149 >> 0x20);
                auVar170._12_4_ = auVar171._12_4_;
                auVar170._8_2_ = 0;
                auVar170._0_8_ = uVar149;
                auVar170._10_2_ = uVar176;
                auVar169._10_6_ = auVar170._10_6_;
                auVar169._8_2_ = uVar176;
                auVar169._0_8_ = uVar149;
                uVar176 = (undefined2)(uVar149 >> 0x10);
                auVar103._4_8_ = auVar169._8_8_;
                auVar103._2_2_ = uVar176;
                auVar103._0_2_ = uVar176;
                auVar172._0_4_ = (int)(short)uVar149;
                auVar172._4_4_ = auVar103._0_4_ >> 0x10;
                auVar172._8_4_ = auVar169._8_4_ >> 0x10;
                auVar172._12_4_ = auVar170._12_4_ >> 0x10;
                uVar149 = *(ulong *)((long)pvVar135 + lVar129);
                auVar25._8_4_ = 0;
                auVar25._0_8_ = uVar149;
                auVar25._12_2_ = (short)(uVar149 >> 0x30);
                auVar48._8_2_ = (short)(uVar149 >> 0x20);
                auVar48._0_8_ = uVar149;
                auVar48._10_4_ = auVar25._10_4_;
                auVar104._6_8_ = 0;
                auVar104._0_6_ = auVar48._8_6_;
                auVar186._6_8_ = SUB148(auVar104 << 0x40,6);
                auVar186._4_2_ = (short)(uVar149 >> 0x10);
                auVar186._0_2_ = (ushort)uVar149;
                auVar186._2_2_ = 0;
                auVar186._14_2_ = 0;
                auVar214 = pmaddwd(auVar186,auVar172);
                lVar152 = lVar129 * 2;
                iVar163 = *(int *)((long)&top_blob_bordered.data + lVar152 + 4);
                iVar177 = *(int *)((long)&top_blob_bordered.refcount + lVar152);
                iVar234 = *(int *)((long)&top_blob_bordered.refcount + lVar152 + 4);
                lVar128 = lVar129 * 2;
                *(int *)((long)&top_blob_bordered.data + lVar128) =
                     auVar214._0_4_ + *(int *)((long)&top_blob_bordered.data + lVar152);
                *(int *)((long)&top_blob_bordered.data + lVar128 + 4) = auVar214._4_4_ + iVar163;
                *(int *)((long)&top_blob_bordered.refcount + lVar128) = auVar214._8_4_ + iVar177;
                *(int *)((long)&top_blob_bordered.refcount + lVar128 + 4) =
                     auVar214._12_4_ + iVar234;
                uVar149 = *(ulong *)((long)pvVar133 + lVar129);
                auVar26._8_4_ = 0;
                auVar26._0_8_ = uVar149;
                auVar26._12_2_ = (short)(uVar149 >> 0x30);
                auVar49._8_2_ = (short)(uVar149 >> 0x20);
                auVar49._0_8_ = uVar149;
                auVar49._10_4_ = auVar26._10_4_;
                auVar105._6_8_ = 0;
                auVar105._0_6_ = auVar49._8_6_;
                auVar187._6_8_ = SUB148(auVar105 << 0x40,6);
                auVar187._4_2_ = (short)(uVar149 >> 0x10);
                auVar187._0_2_ = (ushort)uVar149;
                auVar187._2_2_ = 0;
                auVar187._14_2_ = 0;
                auVar214 = pmaddwd(auVar187,auVar172);
                iVar163 = *(int *)(local_168 + lVar129 * 2 + -8);
                iVar177 = *(int *)(local_168 + lVar129 * 2 + -4);
                *(int *)(d1 + lVar129) = auVar214._0_4_ + *(int *)(d1 + lVar129);
                *(int *)(d1 + lVar129 + 2) = auVar214._4_4_ + *(int *)(d1 + lVar129 + 2);
                *(int *)(local_168 + lVar129 * 2 + -8) = auVar214._8_4_ + iVar163;
                *(int *)(local_168 + lVar129 * 2 + -4) = auVar214._12_4_ + iVar177;
                uVar149 = *(ulong *)((long)pvVar159 + lVar129);
                auVar27._8_4_ = 0;
                auVar27._0_8_ = uVar149;
                auVar27._12_2_ = (short)(uVar149 >> 0x30);
                auVar50._8_2_ = (short)(uVar149 >> 0x20);
                auVar50._0_8_ = uVar149;
                auVar50._10_4_ = auVar27._10_4_;
                auVar106._6_8_ = 0;
                auVar106._0_6_ = auVar50._8_6_;
                auVar188._6_8_ = SUB148(auVar106 << 0x40,6);
                auVar188._4_2_ = (short)(uVar149 >> 0x10);
                auVar188._0_2_ = (ushort)uVar149;
                auVar188._2_2_ = 0;
                auVar188._14_2_ = 0;
                auVar214 = pmaddwd(auVar188,auVar172);
                iVar163 = *(int *)((long)aiStack_130 + lVar129 * 2);
                iVar177 = *(int *)(local_128 + lVar129 * 2 + -4);
                *(int *)(d2 + lVar129) = auVar214._0_4_ + *(int *)(d2 + lVar129);
                *(int *)(d2 + lVar129 + 2) = auVar214._4_4_ + *(int *)(d2 + lVar129 + 2);
                *(int *)((long)aiStack_130 + lVar129 * 2) = auVar214._8_4_ + iVar163;
                *(int *)(local_128 + lVar129 * 2 + -4) = auVar214._12_4_ + iVar177;
                uVar149 = *(ulong *)((long)pvVar130 + lVar129);
                auVar28._8_4_ = 0;
                auVar28._0_8_ = uVar149;
                auVar28._12_2_ = (short)(uVar149 >> 0x30);
                auVar51._8_2_ = (short)(uVar149 >> 0x20);
                auVar51._0_8_ = uVar149;
                auVar51._10_4_ = auVar28._10_4_;
                auVar107._6_8_ = 0;
                auVar107._0_6_ = auVar51._8_6_;
                auVar189._6_8_ = SUB148(auVar107 << 0x40,6);
                auVar189._4_2_ = (short)(uVar149 >> 0x10);
                auVar189._0_2_ = (ushort)uVar149;
                auVar189._2_2_ = 0;
                auVar189._14_2_ = 0;
                auVar214 = pmaddwd(auVar189,auVar172);
                auVar190._0_4_ = auVar214._0_4_ + *(int *)(d3 + lVar129);
                auVar190._4_4_ = auVar214._4_4_ + *(int *)(d3 + lVar129 + 2);
                auVar190._8_4_ = auVar214._8_4_ + *(int *)((long)aiStack_e0 + lVar129 * 2);
                auVar190._12_4_ = auVar214._12_4_ + *(int *)(local_d8 + lVar129 * 2 + -4);
                *(undefined1 (*) [16])(d3 + lVar129) = auVar190;
                lVar129 = lVar129 + 8;
              } while (lVar129 != 0x20);
              uVar146 = uVar146 + 1;
              lVar158 = lVar158 + uVar127 * 2;
              pvVar135 = (void *)((long)pvVar135 + lVar156);
              pvVar133 = (void *)((long)pvVar133 + lVar156);
              pvVar159 = (void *)((long)pvVar159 + lVar156);
              pvVar130 = (void *)((long)pvVar130 + lVar156);
            } while (uVar146 != uVar131);
          }
          lVar129 = 0;
          do {
            *(undefined4 *)((long)pvVar139 + lVar129) =
                 *(undefined4 *)((long)&top_blob_bordered.data + lVar129);
            *(undefined4 *)((long)pvVar142 + lVar129) = *(undefined4 *)((long)d1 + lVar129);
            *(undefined4 *)((long)pvVar143 + lVar129) = *(undefined4 *)((long)d2 + lVar129);
            *(undefined4 *)((long)pvVar157 + lVar129) = *(undefined4 *)((long)d3 + lVar129);
            lVar129 = lVar129 + 4;
          } while (lVar129 != 0x40);
          pvVar150 = (void *)((long)pvVar150 + 1);
          pvVar157 = (void *)((long)pvVar157 + 0x40);
          pvVar143 = (void *)((long)pvVar143 + 0x40);
          pvVar142 = (void *)((long)pvVar142 + 0x40);
          pvVar139 = (void *)((long)pvVar139 + 0x40);
        } while (pvVar150 != local_180);
      }
      pvVar157 = (void *)((long)local_1a8 + 1);
      local_298 = (void *)((long)local_298 + local_1c0);
      local_230 = (void *)((long)local_230 + local_1c0);
      local_240 = (void *)((long)local_240 + local_1c0);
      local_238 = (void *)((long)local_238 + local_1c0);
      local_2b0 = (void *)((long)local_2b0 + local_80);
      local_248 = (void *)((long)local_248 + local_80);
      local_250 = (void *)((long)local_250 + local_80);
      local_258 = (void *)((long)local_258 + local_80);
    } while (pvVar157 != local_1b8);
  }
  uVar237 = SUB84(pvVar157,0);
  if ((uint)local_1b0 != uVar2) {
    local_2e0 = kernel_tm->data;
    sVar5 = kernel_tm->elemsize;
    local_190 = (void *)(uVar127 * 2);
    lVar155 = uVar127 * 8;
    lVar141 = kernel_tm->cstep * sVar5;
    local_2e8 = (void *)(lVar141 * local_1b0 + (long)local_2e0);
    local_198 = (void *)((long)local_2f0 + uVar127 * 2);
    local_1a0 = (void *)((long)local_2f0 + uVar127 * 4);
    local_1b8 = (void *)(sVar5 * 2);
    local_1a8 = (void *)((long)local_2f0 + uVar127 * 6);
    local_1c0 = sVar5 * 3;
    lVar156 = kernel_tm->cstep * local_1b0;
    local_2b0 = (void *)((long)local_2f8 + uVar127 * local_1b0 * 4);
    pvVar157 = local_2f8;
    uVar146 = local_1b0;
    do {
      local_1b0 = uVar146;
      if (0 < (int)uVar125) {
        lVar129 = (long)kernel_tm->w;
        lVar158 = sVar5 * 4 * lVar129;
        pvVar142 = (void *)0x0;
        pvVar139 = local_2b0;
        do {
          uVar149 = (ulong)(uint)((int)pvVar142 << 5);
          uVar146 = 0;
          top_blob_bordered.h = 0;
          top_blob_bordered.c = 0;
          top_blob_bordered.cstep = 0;
          top_blob_bordered.allocator = (Allocator *)0x0;
          top_blob_bordered.dims = 0;
          top_blob_bordered.w = 0;
          top_blob_bordered.elemsize = 0;
          top_blob_bordered.elempack = 0;
          top_blob_bordered._28_4_ = 0;
          top_blob_bordered.data = (void *)0x0;
          top_blob_bordered.refcount._0_4_ = 0;
          top_blob_bordered.refcount._4_4_ = 0;
          if (3 < (int)uVar78) {
            lVar153 = (long)local_2f0 + uVar149;
            lVar152 = (long)local_198 + uVar149;
            lVar128 = (long)local_1a0 + uVar149;
            lVar132 = (long)local_1a8 + uVar149;
            uVar151 = 0;
            pvVar157 = (void *)((long)local_2e8 + lVar129 * sVar5);
            pvVar143 = local_2e8;
            pvVar150 = (void *)((long)local_1b8 * lVar129 + (long)local_2e8);
            pvVar135 = (void *)(local_1c0 * lVar129 + (long)local_2e8);
            do {
              lVar140 = 0;
              do {
                uVar146 = *(ulong *)(lVar153 + lVar140);
                uVar148 = *(ulong *)((long)pvVar143 + lVar140);
                uVar176 = (undefined2)(uVar148 >> 0x30);
                auVar194._8_4_ = 0;
                auVar194._0_8_ = uVar148;
                auVar194._12_2_ = uVar176;
                auVar194._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar148 >> 0x20);
                auVar193._12_4_ = auVar194._12_4_;
                auVar193._8_2_ = 0;
                auVar193._0_8_ = uVar148;
                auVar193._10_2_ = uVar176;
                auVar192._10_6_ = auVar193._10_6_;
                auVar192._8_2_ = uVar176;
                auVar192._0_8_ = uVar148;
                uVar176 = (undefined2)(uVar148 >> 0x10);
                auVar191._8_8_ = auVar192._8_8_;
                auVar191._6_2_ = uVar176;
                auVar191._4_2_ = uVar176;
                auVar191._0_2_ = (undefined2)uVar148;
                auVar191._2_2_ = auVar191._0_2_;
                auVar52._8_4_ = 0;
                auVar52._0_8_ = uVar146;
                auVar52._12_2_ = (short)(uVar146 >> 0x30);
                auVar60._8_2_ = (short)(uVar146 >> 0x20);
                auVar60._0_8_ = uVar146;
                auVar60._10_4_ = auVar52._10_4_;
                auVar108._6_8_ = 0;
                auVar108._0_6_ = auVar60._8_6_;
                auVar73._4_2_ = (short)(uVar146 >> 0x10);
                auVar73._0_4_ = (uint)uVar146;
                auVar73._6_8_ = SUB148(auVar108 << 0x40,6);
                auVar173._0_4_ = (uint)uVar146 & 0xffff;
                auVar173._4_10_ = auVar73._4_10_;
                auVar173._14_2_ = 0;
                auVar214 = pmaddwd(auVar173,auVar191);
                lVar1 = lVar140 * 2;
                iVar145 = auVar214._0_4_ + *(int *)((long)&top_blob_bordered.data + lVar1);
                iVar163 = auVar214._4_4_ + *(int *)((long)&top_blob_bordered.data + lVar1 + 4);
                iVar177 = auVar214._8_4_ + *(int *)((long)&top_blob_bordered.refcount + lVar1);
                iVar234 = auVar214._12_4_ + *(int *)((long)&top_blob_bordered.refcount + lVar1 + 4);
                lVar1 = lVar140 * 2;
                *(int *)((long)&top_blob_bordered.data + lVar1) = iVar145;
                *(int *)((long)&top_blob_bordered.data + lVar1 + 4) = iVar163;
                *(int *)((long)&top_blob_bordered.refcount + lVar1) = iVar177;
                *(int *)((long)&top_blob_bordered.refcount + lVar1 + 4) = iVar234;
                uVar146 = *(ulong *)(lVar152 + lVar140);
                uVar148 = *(ulong *)((long)pvVar157 + lVar140);
                uVar176 = (undefined2)(uVar148 >> 0x30);
                auVar222._8_4_ = 0;
                auVar222._0_8_ = uVar148;
                auVar222._12_2_ = uVar176;
                auVar222._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar148 >> 0x20);
                auVar221._12_4_ = auVar222._12_4_;
                auVar221._8_2_ = 0;
                auVar221._0_8_ = uVar148;
                auVar221._10_2_ = uVar176;
                auVar220._10_6_ = auVar221._10_6_;
                auVar220._8_2_ = uVar176;
                auVar220._0_8_ = uVar148;
                uVar176 = (undefined2)(uVar148 >> 0x10);
                auVar219._8_8_ = auVar220._8_8_;
                auVar219._6_2_ = uVar176;
                auVar219._4_2_ = uVar176;
                auVar219._0_2_ = (undefined2)uVar148;
                auVar219._2_2_ = auVar219._0_2_;
                auVar53._8_4_ = 0;
                auVar53._0_8_ = uVar146;
                auVar53._12_2_ = (short)(uVar146 >> 0x30);
                auVar61._8_2_ = (short)(uVar146 >> 0x20);
                auVar61._0_8_ = uVar146;
                auVar61._10_4_ = auVar53._10_4_;
                auVar109._6_8_ = 0;
                auVar109._0_6_ = auVar61._8_6_;
                auVar74._4_2_ = (short)(uVar146 >> 0x10);
                auVar74._0_4_ = (uint)uVar146;
                auVar74._6_8_ = SUB148(auVar109 << 0x40,6);
                auVar195._0_4_ = (uint)uVar146 & 0xffff;
                auVar195._4_10_ = auVar74._4_10_;
                auVar195._14_2_ = 0;
                auVar214 = pmaddwd(auVar195,auVar219);
                iVar145 = auVar214._0_4_ + iVar145;
                iVar163 = auVar214._4_4_ + iVar163;
                iVar177 = auVar214._8_4_ + iVar177;
                iVar234 = auVar214._12_4_ + iVar234;
                lVar1 = lVar140 * 2;
                *(int *)((long)&top_blob_bordered.data + lVar1) = iVar145;
                *(int *)((long)&top_blob_bordered.data + lVar1 + 4) = iVar163;
                *(int *)((long)&top_blob_bordered.refcount + lVar1) = iVar177;
                *(int *)((long)&top_blob_bordered.refcount + lVar1 + 4) = iVar234;
                uVar146 = *(ulong *)(lVar128 + lVar140);
                uVar148 = *(ulong *)((long)pvVar150 + lVar140);
                uVar176 = (undefined2)(uVar148 >> 0x30);
                auVar226._8_4_ = 0;
                auVar226._0_8_ = uVar148;
                auVar226._12_2_ = uVar176;
                auVar226._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar148 >> 0x20);
                auVar225._12_4_ = auVar226._12_4_;
                auVar225._8_2_ = 0;
                auVar225._0_8_ = uVar148;
                auVar225._10_2_ = uVar176;
                auVar224._10_6_ = auVar225._10_6_;
                auVar224._8_2_ = uVar176;
                auVar224._0_8_ = uVar148;
                uVar176 = (undefined2)(uVar148 >> 0x10);
                auVar223._8_8_ = auVar224._8_8_;
                auVar223._6_2_ = uVar176;
                auVar223._4_2_ = uVar176;
                auVar223._0_2_ = (undefined2)uVar148;
                auVar223._2_2_ = auVar223._0_2_;
                auVar54._8_4_ = 0;
                auVar54._0_8_ = uVar146;
                auVar54._12_2_ = (short)(uVar146 >> 0x30);
                auVar62._8_2_ = (short)(uVar146 >> 0x20);
                auVar62._0_8_ = uVar146;
                auVar62._10_4_ = auVar54._10_4_;
                auVar110._6_8_ = 0;
                auVar110._0_6_ = auVar62._8_6_;
                auVar174._6_8_ = SUB148(auVar110 << 0x40,6);
                auVar174._4_2_ = (short)(uVar146 >> 0x10);
                auVar174._0_2_ = (ushort)uVar146;
                auVar174._2_2_ = 0;
                auVar174._14_2_ = 0;
                auVar214 = pmaddwd(auVar174,auVar223);
                iVar145 = auVar214._0_4_ + iVar145;
                iVar163 = auVar214._4_4_ + iVar163;
                iVar177 = auVar214._8_4_ + iVar177;
                iVar234 = auVar214._12_4_ + iVar234;
                lVar1 = lVar140 * 2;
                *(int *)((long)&top_blob_bordered.data + lVar1) = iVar145;
                *(int *)((long)&top_blob_bordered.data + lVar1 + 4) = iVar163;
                *(int *)((long)&top_blob_bordered.refcount + lVar1) = iVar177;
                *(int *)((long)&top_blob_bordered.refcount + lVar1 + 4) = iVar234;
                uVar146 = *(ulong *)(lVar132 + lVar140);
                uVar148 = *(ulong *)((long)pvVar135 + lVar140);
                uVar176 = (undefined2)(uVar148 >> 0x30);
                auVar230._8_4_ = 0;
                auVar230._0_8_ = uVar148;
                auVar230._12_2_ = uVar176;
                auVar230._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar148 >> 0x20);
                auVar229._12_4_ = auVar230._12_4_;
                auVar229._8_2_ = 0;
                auVar229._0_8_ = uVar148;
                auVar229._10_2_ = uVar176;
                auVar228._10_6_ = auVar229._10_6_;
                auVar228._8_2_ = uVar176;
                auVar228._0_8_ = uVar148;
                uVar176 = (undefined2)(uVar148 >> 0x10);
                auVar227._8_8_ = auVar228._8_8_;
                auVar227._6_2_ = uVar176;
                auVar227._4_2_ = uVar176;
                auVar227._0_2_ = (undefined2)uVar148;
                auVar227._2_2_ = auVar227._0_2_;
                auVar55._8_4_ = 0;
                auVar55._0_8_ = uVar146;
                auVar55._12_2_ = (short)(uVar146 >> 0x30);
                auVar63._8_2_ = (short)(uVar146 >> 0x20);
                auVar63._0_8_ = uVar146;
                auVar63._10_4_ = auVar55._10_4_;
                auVar111._6_8_ = 0;
                auVar111._0_6_ = auVar63._8_6_;
                auVar196._6_8_ = SUB148(auVar111 << 0x40,6);
                auVar196._4_2_ = (short)(uVar146 >> 0x10);
                auVar196._0_2_ = (ushort)uVar146;
                auVar196._2_2_ = 0;
                auVar196._14_2_ = 0;
                auVar214 = pmaddwd(auVar196,auVar227);
                auVar197._0_4_ = auVar214._0_4_ + iVar145;
                auVar197._4_4_ = auVar214._4_4_ + iVar163;
                auVar197._8_4_ = auVar214._8_4_ + iVar177;
                auVar197._12_4_ = auVar214._12_4_ + iVar234;
                *(undefined1 (*) [16])((long)&top_blob_bordered.data + lVar140 * 2) = auVar197;
                lVar140 = lVar140 + 8;
              } while (lVar140 != 0x20);
              uVar146 = uVar151 + 4;
              lVar140 = uVar151 + 7;
              lVar153 = lVar153 + lVar155;
              pvVar143 = (void *)((long)pvVar143 + lVar158);
              lVar152 = lVar152 + lVar155;
              pvVar157 = (void *)((long)pvVar157 + lVar158);
              lVar128 = lVar128 + lVar155;
              pvVar150 = (void *)((long)pvVar150 + lVar158);
              lVar132 = lVar132 + lVar155;
              pvVar135 = (void *)((long)pvVar135 + lVar158);
              uVar151 = uVar146;
            } while (lVar140 < lVar123);
          }
          if ((int)uVar146 < (int)uVar78) {
            uVar146 = uVar146 & 0xffffffff;
            lVar152 = (long)local_2f0 + (long)local_190 * uVar146 + uVar149;
            pvVar157 = (void *)((lVar129 * uVar146 + lVar156) * sVar5 + (long)local_2e0);
            do {
              lVar128 = 0;
              do {
                uVar149 = *(ulong *)(lVar152 + lVar128 * 2);
                uVar151 = *(ulong *)((long)pvVar157 + lVar128 * 2);
                uVar176 = (undefined2)(uVar151 >> 0x30);
                auVar201._8_4_ = 0;
                auVar201._0_8_ = uVar151;
                auVar201._12_2_ = uVar176;
                auVar201._14_2_ = uVar176;
                uVar176 = (undefined2)(uVar151 >> 0x20);
                auVar200._12_4_ = auVar201._12_4_;
                auVar200._8_2_ = 0;
                auVar200._0_8_ = uVar151;
                auVar200._10_2_ = uVar176;
                auVar199._10_6_ = auVar200._10_6_;
                auVar199._8_2_ = uVar176;
                auVar199._0_8_ = uVar151;
                uVar176 = (undefined2)(uVar151 >> 0x10);
                auVar198._8_8_ = auVar199._8_8_;
                auVar198._6_2_ = uVar176;
                auVar198._4_2_ = uVar176;
                auVar198._0_2_ = (undefined2)uVar151;
                auVar198._2_2_ = auVar198._0_2_;
                auVar56._8_4_ = 0;
                auVar56._0_8_ = uVar149;
                auVar56._12_2_ = (short)(uVar149 >> 0x30);
                auVar64._8_2_ = (short)(uVar149 >> 0x20);
                auVar64._0_8_ = uVar149;
                auVar64._10_4_ = auVar56._10_4_;
                auVar112._6_8_ = 0;
                auVar112._0_6_ = auVar64._8_6_;
                auVar175._6_8_ = SUB148(auVar112 << 0x40,6);
                auVar175._4_2_ = (short)(uVar149 >> 0x10);
                auVar175._0_2_ = (ushort)uVar149;
                auVar175._2_2_ = 0;
                auVar175._14_2_ = 0;
                auVar214 = pmaddwd(auVar175,auVar198);
                lVar132 = lVar128 * 4;
                iVar145 = *(int *)((long)&top_blob_bordered.data + lVar132 + 4);
                iVar163 = *(int *)((long)&top_blob_bordered.refcount + lVar132);
                iVar177 = *(int *)((long)&top_blob_bordered.refcount + lVar132 + 4);
                lVar153 = lVar128 * 4;
                *(int *)((long)&top_blob_bordered.data + lVar153) =
                     auVar214._0_4_ + *(int *)((long)&top_blob_bordered.data + lVar132);
                *(int *)((long)&top_blob_bordered.data + lVar153 + 4) = auVar214._4_4_ + iVar145;
                *(int *)((long)&top_blob_bordered.refcount + lVar153) = auVar214._8_4_ + iVar163;
                *(int *)((long)&top_blob_bordered.refcount + lVar153 + 4) =
                     auVar214._12_4_ + iVar177;
                lVar128 = lVar128 + 4;
              } while (lVar128 != 0x10);
              uVar146 = uVar146 + 1;
              lVar152 = lVar152 + (long)local_190;
              pvVar157 = (void *)((long)pvVar157 + lVar129 * sVar5);
            } while (uVar146 != uVar131);
          }
          lVar152 = 0;
          do {
            uVar122 = *(uint *)((long)&top_blob_bordered.data + lVar152 * 4);
            pvVar157 = (void *)(ulong)uVar122;
            *(uint *)((long)pvVar139 + lVar152 * 4) = uVar122;
            lVar152 = lVar152 + 1;
          } while (lVar152 != 0x10);
          pvVar142 = (void *)((long)pvVar142 + 1);
          pvVar139 = (void *)((long)pvVar139 + 0x40);
        } while (pvVar142 != local_180);
      }
      uVar237 = SUB84(pvVar157,0);
      local_2e8 = (void *)((long)local_2e8 + lVar141);
      local_2e0 = (void *)((long)local_2e0 + lVar141);
      local_2b0 = (void *)((long)local_2b0 + uVar127 * 4);
      uVar146 = local_1b0 + 1;
    } while ((long)(local_1b0 + 1) < (long)local_1c8);
  }
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  if (local_2d0 != (int *)0x0) {
    LOCK();
    *local_2d0 = *local_2d0 + -1;
    UNLOCK();
    if (*local_2d0 == 0) {
      if (pAVar4 == (Allocator *)0x0) {
        if (local_2f0 != (void *)0x0) {
          free(local_2f0);
        }
      }
      else {
        (**(code **)(*(long *)pAVar4 + 0x18))(pAVar4,local_2f0);
      }
    }
  }
  pOVar121 = local_1d0;
  pAVar4 = top_blob_bordered.allocator;
  pvVar157 = top_blob_bordered.data;
  piVar3 = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (**(code **)(*(long *)top_blob_bordered.allocator + 0x18))();
      }
    }
  }
  top_blob_bordered.allocator = pOVar121->workspace_allocator;
  auVar118._4_4_ = -(uint)(uStack_74 == 0);
  auVar118._0_4_ = -(uint)(local_78 == 0);
  auVar118._8_4_ = -(uint)(uVar2 == 0);
  auVar118._12_4_ = 0;
  movmskps(uVar237,auVar118 << 0x20);
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.refcount = (int *)0x0;
  top_blob_bordered.elemsize = 4;
  top_blob_bordered.elempack = 1;
  top_blob_bordered.dims = 3;
  top_blob_bordered.w = (int)local_a0;
  top_blob_bordered.h = local_184;
  top_blob_bordered.cstep = (long)(int)(local_184 * top_blob_bordered.w) & 0x3ffffffffffffffc;
  lVar123 = top_blob_bordered.cstep * local_1c8;
  top_blob_bordered.c = uVar2;
  if (lVar123 != 0) {
    sVar138 = lVar123 * 4 + 4;
    if (top_blob_bordered.allocator == (Allocator *)0x0) {
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uStack_170;
      _d1 = auVar113 << 0x40;
      iVar145 = posix_memalign((void **)d1,0x10,sVar138);
      if (iVar145 != 0) {
        auVar114._8_8_ = 0;
        auVar114._0_8_ = uStack_170;
        _d1 = auVar114 << 0x40;
      }
      top_blob_bordered.data = (void *)d1;
    }
    else {
      top_blob_bordered.data =
           (void *)(**(code **)(*(long *)top_blob_bordered.allocator + 0x10))
                             (top_blob_bordered.allocator,sVar138);
    }
    top_blob_bordered.refcount = (int *)((long)top_blob_bordered.data + lVar123 * 4);
    *(undefined4 *)((long)top_blob_bordered.data + lVar123 * 4) = 1;
  }
  if (0 < (int)uVar2) {
    uVar131 = 1;
    if (1 < (int)uVar160) {
      uVar131 = (ulong)uVar160;
    }
    uVar146 = 1;
    if (1 < (int)uVar162) {
      uVar146 = (ulong)uVar162;
    }
    local_228 = (long)local_2f8 + 0x30;
    uVar149 = 0;
    do {
      if (0 < local_f8._4_4_) {
        lVar155 = top_blob_bordered.cstep * top_blob_bordered.elemsize * uVar149;
        uVar151 = 0;
        lVar123 = local_228;
        do {
          if (0 < (int)local_f8) {
            puVar144 = (undefined8 *)
                       ((long)top_blob_bordered.data +
                       (uVar151 * 2 + 1) * (long)top_blob_bordered.w * top_blob_bordered.elemsize +
                       lVar155);
            puVar136 = (undefined8 *)
                       ((long)top_blob_bordered.data +
                       uVar151 * 2 * (long)top_blob_bordered.w * top_blob_bordered.elemsize +
                       lVar155);
            uVar148 = 0;
            lVar141 = lVar123;
            do {
              lVar156 = 0;
              do {
                *(undefined4 *)((long)d1 + lVar156) = *(undefined4 *)(lVar141 + -0x30 + lVar156);
                *(undefined4 *)((long)d2 + lVar156) = *(undefined4 *)(lVar141 + -0x20 + lVar156);
                *(undefined4 *)((long)d3 + lVar156) = *(undefined4 *)(lVar141 + -0x10 + lVar156);
                *(undefined4 *)((long)s3 + lVar156) = *(undefined4 *)(lVar141 + lVar156);
                lVar156 = lVar156 + 4;
              } while (lVar156 != 0x10);
              iVar177 = d1._4_4_ + d2._4_4_ + d3._4_4_;
              iVar234 = (int)uStack_170 + aiStack_130[0] + aiStack_e0[0];
              iVar145 = (d2._4_4_ - d3._4_4_) + s3[1];
              iVar163 = (aiStack_130[0] - aiStack_e0[0]) + s3[2];
              *puVar136 = CONCAT44((d2._0_4_ - d3._0_4_) + s3[0] + iVar163 + iVar145 >> 2,
                                   d1._0_4_ + d2._0_4_ + d3._0_4_ + iVar234 + iVar177 >> 2);
              *puVar144 = CONCAT44((iVar145 - iVar163) + (aiStack_130[1] - aiStack_e0[1]) + s3[3] >>
                                   2,(iVar177 - iVar234) +
                                     uStack_170._4_4_ + aiStack_130[1] + aiStack_e0[1] >> 2);
              puVar136 = puVar136 + 1;
              puVar144 = puVar144 + 1;
              uVar148 = uVar148 + 1;
              lVar141 = lVar141 + 0x40;
            } while (uVar148 != uVar131);
          }
          uVar151 = uVar151 + 1;
          lVar123 = lVar123 + (long)(int)uVar160 * 0x40;
        } while (uVar151 != uVar146);
      }
      uVar149 = uVar149 + 1;
      local_228 = local_228 + uVar127 * 4;
    } while (uVar149 != uVar2);
  }
  copy_cut_border(&top_blob_bordered,local_98,0,top_blob_bordered.h - local_98->h,0,
                  top_blob_bordered.w - local_98->w,local_1d0);
  if (top_blob_bordered.refcount != (int *)0x0) {
    LOCK();
    *top_blob_bordered.refcount = *top_blob_bordered.refcount + -1;
    UNLOCK();
    if (*top_blob_bordered.refcount == 0) {
      if (top_blob_bordered.allocator == (Allocator *)0x0) {
        if (top_blob_bordered.data != (void *)0x0) {
          free(top_blob_bordered.data);
        }
      }
      else {
        (**(code **)(*(long *)top_blob_bordered.allocator + 0x18))();
      }
    }
  }
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  if (local_2a0 != (int *)0x0) {
    LOCK();
    *local_2a0 = *local_2a0 + -1;
    UNLOCK();
    if (*local_2a0 == 0) {
      if (local_1d8 == (Allocator *)0x0) {
        if (local_2f8 != (void *)0x0) {
          free(local_2f8);
        }
      }
      else {
        (**(code **)(*(long *)local_1d8 + 0x18))(local_1d8,local_2f8);
      }
    }
  }
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (pAVar4 == (Allocator *)0x0) {
        if (pvVar157 != (void *)0x0) {
          free(pvVar157);
        }
      }
      else {
        (**(code **)(*(long *)pAVar4 + 0x18))(pAVar4,pvVar157);
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_218._12_4_,local_218._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_218._32_8_ == (Allocator *)0x0) {
        if ((void *)local_218._0_8_ != (void *)0x0) {
          free((void *)local_218._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_218._32_8_ + 0x18))();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4*4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4],d1[4],d2[4],d3[4];
                    short w0[4],w1[4],w2[4],w3[4];
                    short t0[4],t1[4],t2[4],t3[4];
                    // load 
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }                                  
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {   
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }                                
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {   
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }                
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 4] = d1[n];
                        out_tm0[n+ 8] = d2[n];
                        out_tm0[n+12] = d3[n];
                    }                  

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();
    
    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p+1);
            Mat out2_tm = top_blob_tm.channel(p+2);
            Mat out3_tm = top_blob_tm.channel(p+3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p+1);
            const Mat kernel2_tm = kernel_tm.channel(p+2);
            const Mat kernel3_tm = kernel_tm.channel(p+3);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q+3<inch; q+=4)
                {   
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q+1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q+2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q+3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n=0; n<16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q+3<inch; q+=4)
                {   
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q+1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q+2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q+3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q+1);
                    const short* k2 = kernel0_tm.row<short>(q+2);
                    const short* k3 = kernel0_tm.row<short>(q+3);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }             
                }

                for (int n=0; n<16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot    

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // }; 

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j=0; j<nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j*2);
                int* outRow1 = out.row<int>(j*2+1);

                for(int i=0; i<nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j*nRowBlocks + i);

                    int s0[4],s1[4],s2[4],s3[4];
                    int w0[4],w1[4];
                    int d0[2],d1[2],d2[2],d3[2];
                    int o0[2],o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 4];
                        s2[n] = out_tile[n+ 8];
                        s3[n] = out_tile[n+12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0];
                        d1[0] = w0[1]; d1[1] = w1[1];
                        d2[0] = w0[2]; d2[1] = w1[2];
                        d3[0] = w0[3]; d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;           
                }
            }
        }        
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}